

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void __thiscall google::protobuf::CEscapeAndAppend(protobuf *this,StringPiece src,string *dest)

{
  byte bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  stringpiece_ssize_type sVar6;
  char *pcVar7;
  int local_4c;
  uchar c;
  byte *pbStack_48;
  int i;
  char *append_ptr;
  size_t cur_dest_len;
  size_t escaped_len;
  string *dest_local;
  StringPiece src_local;
  
  pcVar7 = (char *)src.length_;
  src_local.ptr_ = src.ptr_;
  dest_local = (string *)this;
  sVar3 = CEscapedLength(this,src);
  sVar4 = StringPiece::size((StringPiece *)&dest_local);
  if (sVar3 == sVar4) {
    pcVar5 = StringPiece::data((StringPiece *)&dest_local);
    StringPiece::size((StringPiece *)&dest_local);
    std::__cxx11::string::append(pcVar7,(ulong)pcVar5);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)pcVar7);
    pbStack_48 = (byte *)std::__cxx11::string::operator[]((ulong)pcVar7);
    for (local_4c = 0; sVar6 = StringPiece::size((StringPiece *)&dest_local), local_4c < sVar6;
        local_4c = local_4c + 1) {
      bVar1 = StringPiece::operator[]((StringPiece *)&dest_local,(long)local_4c);
      if (bVar1 == 9) {
        *pbStack_48 = 0x5c;
        pbStack_48[1] = 0x74;
        pbStack_48 = pbStack_48 + 2;
      }
      else if (bVar1 == 10) {
        *pbStack_48 = 0x5c;
        pbStack_48[1] = 0x6e;
        pbStack_48 = pbStack_48 + 2;
      }
      else if (bVar1 == 0xd) {
        *pbStack_48 = 0x5c;
        pbStack_48[1] = 0x72;
        pbStack_48 = pbStack_48 + 2;
      }
      else if (bVar1 == 0x22) {
        *pbStack_48 = 0x5c;
        pbStack_48[1] = 0x22;
        pbStack_48 = pbStack_48 + 2;
      }
      else if (bVar1 == 0x27) {
        *pbStack_48 = 0x5c;
        pbStack_48[1] = 0x27;
        pbStack_48 = pbStack_48 + 2;
      }
      else if (bVar1 == 0x5c) {
        *pbStack_48 = 0x5c;
        pbStack_48[1] = 0x5c;
        pbStack_48 = pbStack_48 + 2;
      }
      else {
        uVar2 = isprint((int)(char)bVar1);
        if ((uVar2 & 1) == 0) {
          *pbStack_48 = 0x5c;
          pbStack_48[1] = bVar1 / 0x40 + 0x30;
          pbStack_48[2] = (char)(((ulong)bVar1 % 0x40) / 8) + 0x30;
          pbStack_48[3] = bVar1 % 8 + 0x30;
          pbStack_48 = pbStack_48 + 4;
        }
        else {
          *pbStack_48 = bVar1;
          pbStack_48 = pbStack_48 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void CEscapeAndAppend(StringPiece src, string* dest) {
  size_t escaped_len = CEscapedLength(src);
  if (escaped_len == src.size()) {
    dest->append(src.data(), src.size());
    return;
  }

  size_t cur_dest_len = dest->size();
  dest->resize(cur_dest_len + escaped_len);
  char* append_ptr = &(*dest)[cur_dest_len];

  for (int i = 0; i < src.size(); ++i) {
    unsigned char c = static_cast<unsigned char>(src[i]);
    switch (c) {
      case '\n': *append_ptr++ = '\\'; *append_ptr++ = 'n'; break;
      case '\r': *append_ptr++ = '\\'; *append_ptr++ = 'r'; break;
      case '\t': *append_ptr++ = '\\'; *append_ptr++ = 't'; break;
      case '\"': *append_ptr++ = '\\'; *append_ptr++ = '\"'; break;
      case '\'': *append_ptr++ = '\\'; *append_ptr++ = '\''; break;
      case '\\': *append_ptr++ = '\\'; *append_ptr++ = '\\'; break;
      default:
        if (!isprint(c)) {
          *append_ptr++ = '\\';
          *append_ptr++ = '0' + c / 64;
          *append_ptr++ = '0' + (c % 64) / 8;
          *append_ptr++ = '0' + c % 8;
        } else {
          *append_ptr++ = c;
        }
        break;
    }
  }
}